

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_TruthPermute_int(int *pMints,int nMints,char *pPerm,int nVars,int *pMintsP)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  memset(pMintsP,0,(long)nMints * 4);
  uVar4 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar4 = uVar2;
  }
  uVar3 = (ulong)(uint)nMints;
  if (nMints < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      if (((uint)pMints[uVar2] >> ((uint)uVar1 & 0x1f) & 1) != 0) {
        pMintsP[uVar2] = pMintsP[uVar2] | 1 << (pPerm[uVar1] & 0x1fU);
      }
    }
  }
  return;
}

Assistant:

void Extra_TruthPermute_int( int * pMints, int nMints, char * pPerm, int nVars, int * pMintsP )
{
    int m, v;
    // clean the storage for minterms
    memset( pMintsP, 0, sizeof(int) * nMints );
    // go through minterms and add the variables
    for ( m = 0; m < nMints; m++ )
        for ( v = 0; v < nVars; v++ )
            if ( pMints[m] & (1 << v) )
                pMintsP[m] |= (1 << pPerm[v]);
}